

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O1

double randn(RandnState *state)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  
  uVar5 = state->g_randn_y;
  uVar3 = state->g_randn_x << 0xb ^ state->g_randn_x;
  state->g_randn_x = uVar5;
  uVar1 = state->g_randn_z;
  state->g_randn_y = uVar1;
  uVar2 = state->g_randn_w;
  state->g_randn_z = uVar2;
  uVar3 = uVar3 >> 8 ^ uVar2 >> 0x13 ^ uVar3 ^ uVar2;
  state->g_randn_w = uVar3;
  uVar6 = uVar3 >> 4;
  iVar8 = 0xb;
  do {
    uVar4 = uVar3;
    uVar7 = uVar2;
    uVar9 = uVar1;
    uVar5 = uVar5 << 0xb ^ uVar5;
    uVar3 = uVar5 >> 8 ^ uVar4 >> 0x13 ^ uVar5 ^ uVar4;
    uVar6 = uVar6 + (uVar3 >> 4);
    iVar8 = iVar8 + -1;
    uVar5 = uVar9;
    uVar1 = uVar7;
    uVar2 = uVar4;
  } while (iVar8 != 0);
  state->g_randn_x = uVar9;
  state->g_randn_y = uVar7;
  state->g_randn_z = uVar4;
  state->g_randn_w = uVar3;
  return (double)uVar6 * 3.725290298461914e-09 + -6.0;
}

Assistant:

double randn(RandnState *state) {
  uint32_t t;
  t = state->g_randn_x ^ (state->g_randn_x << 11);
  state->g_randn_x = state->g_randn_y;
  state->g_randn_y = state->g_randn_z;
  state->g_randn_z = state->g_randn_w;
  state->g_randn_w
    = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));

  uint32_t tmp = state->g_randn_w >> 4;
  for (int i = 0; i < 11; ++i) {
    t = state->g_randn_x ^ (state->g_randn_x << 11);
    state->g_randn_x = state->g_randn_y;
    state->g_randn_y = state->g_randn_z;
    state->g_randn_z = state->g_randn_w;
    state->g_randn_w
      = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));
    tmp += state->g_randn_w >> 4;
  }
  return tmp / 268435456.0 - 6.0;
}